

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O2

_Bool bson_append_timeval(bson_t *bson,char *key,int key_length,timeval *value)

{
  _Bool _Var1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (bson == (bson_t *)0x0) {
    pcVar3 = "bson";
    uVar2 = 0x6f4;
  }
  else if (key == (char *)0x0) {
    pcVar3 = "key";
    uVar2 = 0x6f5;
  }
  else {
    if (value != (timeval *)0x0) {
      _Var1 = bson_append_date_time
                        (bson,key,key_length,value->tv_sec * 1000 + (ulong)value->tv_usec / 1000);
      return _Var1;
    }
    pcVar3 = "value";
    uVar2 = 0x6f6;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
          uVar2,"bson_append_timeval",pcVar3);
  abort();
}

Assistant:

bool
bson_append_timeval (bson_t *bson,
                     const char *key,
                     int key_length,
                     struct timeval *value)
{
   uint64_t unix_msec;

   BSON_ASSERT (bson);
   BSON_ASSERT (key);
   BSON_ASSERT (value);

   unix_msec =
      (((uint64_t) value->tv_sec) * 1000UL) + (value->tv_usec / 1000UL);
   return bson_append_date_time (bson, key, key_length, unix_msec);
}